

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deSocketResult deSocket_send(deSocket *sock,void *buf,size_t bufSize,size_t *numSentPtr)

{
  int numBytes;
  deSocketResult dVar1;
  ssize_t sVar2;
  size_t local_38;
  deSocketResult result;
  int numSent;
  size_t *numSentPtr_local;
  size_t bufSize_local;
  void *buf_local;
  deSocket *sock_local;
  
  sVar2 = send(sock->handle,buf,bufSize,0);
  numBytes = (int)sVar2;
  dVar1 = mapSendRecvResult(numBytes);
  if (numSentPtr != (size_t *)0x0) {
    if (numBytes < 1) {
      local_38 = 0;
    }
    else {
      local_38 = (size_t)numBytes;
    }
    *numSentPtr = local_38;
  }
  if (dVar1 == DE_SOCKETRESULT_CONNECTION_CLOSED) {
    deSocket_setChannelsClosed(sock,2);
  }
  else if (dVar1 == DE_SOCKETRESULT_CONNECTION_TERMINATED) {
    deSocket_setChannelsClosed(sock,3);
  }
  return dVar1;
}

Assistant:

deSocketResult deSocket_send (deSocket* sock, const void* buf, size_t bufSize, size_t* numSentPtr)
{
	int				numSent	= (int)send(sock->handle, (const char*)buf, (NativeSize)bufSize, 0);
	deSocketResult	result	= mapSendRecvResult(numSent);

	if (numSentPtr)
		*numSentPtr = (numSent > 0) ? ((size_t)numSent) : (0);

	/* Update state. */
	if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_SEND);
	else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_BOTH);

	return result;
}